

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

void region_erase_bordered(region_conflict *loc)

{
  int iVar1;
  long lVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  bool bVar6;
  region_conflict rVar7;
  
  rVar7 = region_calculate(*loc);
  wVar4 = L'\x01';
  if (L'\x01' < rVar7.col) {
    wVar4 = rVar7.col;
  }
  wVar3 = L'\x01';
  if (L'\x01' < rVar7.row) {
    wVar3 = rVar7.row;
  }
  wVar3 = wVar3 + L'\xffffffff';
  lVar2 = rVar7._8_8_ + 0x200000000;
  iVar1 = (int)((ulong)lVar2 >> 0x20);
  iVar5 = 0;
  if (iVar1 != 0 && -1 < lVar2) {
    iVar5 = iVar1;
  }
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    Term_erase(wVar4 + L'\xffffffff',wVar3,rVar7.width + L'\x02');
    wVar3 = wVar3 + L'\x01';
  }
  return;
}

Assistant:

void region_erase_bordered(const region *loc)
{
	region calc = region_calculate(*loc);
	int i = 0;

	calc.col = MAX(calc.col - 1, 0);
	calc.row = MAX(calc.row - 1, 0);
	calc.width += 2;
	calc.page_rows += 2;

	for (i = 0; i < calc.page_rows; i++)
		Term_erase(calc.col, calc.row + i, calc.width);
}